

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O1

Response execute_command(IndexFromCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  pointer *taints;
  long lVar1;
  char cVar2;
  runtime_error *this;
  DatabaseSnapshot *in_RCX;
  json_value extraout_RDX;
  Response RVar3;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  ifstream inf;
  DatabaseSnapshot *local_288;
  DatabaseSnapshot *local_280;
  value_type local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  long local_238 [3];
  undefined4 uStack_21c;
  uint auStack_218 [122];
  
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream((istream *)local_238,(string *)task,_S_bin);
  lVar1 = *(long *)(local_238[0] + -0x18);
  if ((*(uint *)((long)auStack_218 + lVar1) & 5) == 0) {
    *(undefined4 *)((long)&uStack_21c + lVar1) = 1;
    local_288 = in_RCX;
    local_280 = snap;
    std::ios::clear((int)&local_288 + (int)lVar1 + 0x50);
    if ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 2) == 0) {
      do {
        local_278._M_string_length = 0;
        local_278.field_2._M_local_buf[0] = '\0';
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_278,cVar2);
        if (local_278._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_258,&local_278);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                   local_278.field_2._M_local_buf[0]) + 1);
        }
      } while ((*(byte *)((long)auStack_218 + *(long *)(local_238[0] + -0x18)) & 2) == 0);
    }
    taints = &task[1].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if (*(char *)&task[3].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl.
                  super__Vector_impl_data._M_start == '\x01') {
      DatabaseSnapshot::recursive_index_paths
                (local_288,(Task *)local_280,
                 (vector<IndexType,_std::allocator<IndexType>_> *)(task + 1),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)taints,&local_258);
    }
    else {
      DatabaseSnapshot::force_recursive_index_paths
                (local_288,(Task *)local_280,
                 (vector<IndexType,_std::allocator<IndexType>_> *)(task + 1),
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)taints,&local_258);
    }
    Response::ok();
    std::ifstream::~ifstream(local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
    RVar3.content.m_value.object = extraout_RDX.object;
    RVar3.content._0_8_ = cmd;
    return (Response)RVar3.content;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed to open file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Response execute_command(const IndexFromCommand &cmd, Task *task,
                         const DatabaseSnapshot *snap) {
    const auto &path_list_fname = cmd.get_path_list_fname();

    std::vector<std::string> paths;
    std::ifstream inf(path_list_fname, std::ifstream::binary);

    if (!inf) {
        throw std::runtime_error("failed to open file");
    }

    inf.exceptions(std::ifstream::badbit);

    while (!inf.eof()) {
        std::string filename;
        std::getline(inf, filename);

        if (!filename.empty()) {
            paths.push_back(filename);
        }
    }

    if (cmd.ensure_unique()) {
        snap->recursive_index_paths(task, cmd.get_index_types(), cmd.taints(),
                                    paths);
    } else {
        snap->force_recursive_index_paths(task, cmd.get_index_types(),
                                          cmd.taints(), paths);
    }

    return Response::ok();
}